

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O3

int __thiscall
GmmLib::GmmPageTableMgr::GetPageTableBOList(GmmPageTableMgr *this,uint8_t TTFlags,void *BOList)

{
  HANDLE pvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  GMM_PAGETABLEPool *pGVar6;
  undefined7 in_register_00000031;
  
  iVar2 = (*this->_vptr_GmmPageTableMgr[5])();
  iVar4 = 0;
  if (iVar2 != 0 && (BOList != (void *)0x0 && (int)CONCAT71(in_register_00000031,TTFlags) != 0)) {
    if (this->AuxTTObj != (AuxTable *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
      if ((this->AuxTTObj != (AuxTable *)0x0) &&
         (pvVar1 = (this->AuxTTObj->super_PageTable).TTL3.L3Handle, pvVar1 != (HANDLE)0x0)) {
        *(HANDLE *)BOList = pvVar1;
      }
    }
    uVar3 = this->NumNodePoolElements;
    if (uVar3 != 0) {
      pGVar6 = this->pPool;
      uVar5 = 0;
      do {
        if (pGVar6 == (GMM_PAGETABLEPool *)0x0) {
          pGVar6 = (GmmPageTablePool *)0x0;
        }
        else {
          *(HANDLE *)((long)BOList + uVar5 * 8 + 8) = pGVar6->PoolHandle;
          pGVar6 = pGVar6->NextPool;
          uVar3 = this->NumNodePoolElements;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
    }
    iVar4 = iVar2;
    if (this->AuxTTObj != (AuxTable *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
    }
  }
  return iVar4;
}

Assistant:

int GmmLib::GmmPageTableMgr::GetPageTableBOList(uint8_t TTFlags, void *BOList)
{
    int                        NumBO   = GetNumOfPageTableBOs(TTFlags);
    HANDLE *                   Handles = (HANDLE *)BOList;
    GmmLib::GMM_PAGETABLEPool *Pool;

    __GMM_ASSERTPTR(TTFlags & AUXTT, 0);
    __GMM_ASSERTPTR(BOList, 0);
    __GMM_ASSERTPTR(NumBO, 0);

    ENTER_CRITICAL_SECTION

    if(AuxTTObj && AuxTTObj->GetL3Handle())
        Handles[0] = AuxTTObj->GetL3Handle();

    Pool = pPool;

    for(int i = 0; i < NumNodePoolElements; i++)
    {
        if(Pool)
        {
            Handles[i + 1] = Pool->GetPoolHandle();
            Pool           = Pool->GetNextPool();
        }
    }

    EXIT_CRITICAL_SECTION

    return NumBO;
}